

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

string * __thiscall
pbrt::BoxFilter::ToString_abi_cxx11_(string *__return_storage_ptr__,BoxFilter *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::Vector2<float>const&>
            (__return_storage_ptr__,"[ BoxFilter radius: %s ]",&this->radius);
  return __return_storage_ptr__;
}

Assistant:

std::string BoxFilter::ToString() const {
    return StringPrintf("[ BoxFilter radius: %s ]", radius);
}